

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MCRegisterInfo.c
# Opt level: O1

uint MCRegisterInfo_getMatchingSuperReg(MCRegisterInfo *RI,uint Reg,uint SubIdx,MCRegisterClass *RC)

{
  ushort *puVar1;
  ushort uVar2;
  ulong uVar3;
  bool bVar4;
  uint uVar5;
  ushort *puVar6;
  ulong uVar7;
  uint Reg_00;
  undefined8 local_38;
  
  local_38 = (ulong)SubIdx << 0x20;
  if (Reg < RI->NumRegs) {
    puVar1 = RI->DiffLists + RI->Desc[Reg].SuperRegs;
    if (RI->DiffLists == (MCPhysReg *)0x0) {
      uVar7 = (ulong)Reg;
      puVar6 = puVar1;
    }
    else {
      uVar7 = (ulong)(Reg + *puVar1);
      puVar6 = puVar1 + 1;
      if (*puVar1 == 0) {
        puVar6 = (ushort *)0x0;
      }
    }
    do {
      if (puVar6 == (ushort *)0x0) {
        local_38 = 0;
        break;
      }
      Reg_00 = (uint)(uVar7 & 0xffff);
      uVar3 = (uVar7 & 0xffff) >> 3;
      if (((uint)uVar3 < (uint)RC->RegSetSize) && ((RC->RegSet[uVar3] >> (Reg_00 & 7) & 1) != 0)) {
        uVar5 = MCRegisterInfo_getSubReg(RI,Reg_00,local_38._4_4_);
        if (uVar5 != Reg) goto LAB_001c9045;
        bVar4 = false;
        local_38 = CONCAT44(local_38._4_4_,Reg_00);
      }
      else {
LAB_001c9045:
        uVar2 = *puVar6;
        uVar7 = (ulong)((int)uVar7 + (uint)uVar2);
        puVar6 = puVar6 + 1;
        if (uVar2 == 0) {
          puVar6 = (ushort *)0x0;
        }
        bVar4 = true;
      }
    } while (bVar4);
  }
  return (uint)local_38;
}

Assistant:

unsigned MCRegisterInfo_getMatchingSuperReg(const MCRegisterInfo *RI, unsigned Reg, unsigned SubIdx, const MCRegisterClass *RC)
{
	DiffListIterator iter;

	if (Reg >= RI->NumRegs) {
		return 0;
	}

	DiffListIterator_init(&iter, (MCPhysReg)Reg, RI->DiffLists + RI->Desc[Reg].SuperRegs);
	DiffListIterator_next(&iter);

	while(DiffListIterator_isValid(&iter)) {
		uint16_t val = DiffListIterator_getVal(&iter);
		if (MCRegisterClass_contains(RC, val) && Reg ==  MCRegisterInfo_getSubReg(RI, val, SubIdx))
			return val;

		DiffListIterator_next(&iter);
	}

	return 0;
}